

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_request.hpp
# Opt level: O1

void __thiscall cinatra::coro_http_request::set_body(coro_http_request *this,string *body)

{
  pointer pcVar1;
  content_type cVar2;
  
  pcVar1 = (body->_M_dataplus)._M_p;
  (this->body_)._M_len = body->_M_string_length;
  (this->body_)._M_str = pcVar1;
  cVar2 = get_content_type(this);
  if (cVar2 == urlencoded) {
    http_parser::parse_query(this->parser_,this->body_);
    return;
  }
  return;
}

Assistant:

void set_body(std::string &body) {
    body_ = body;
    auto type = get_content_type();
    if (type == content_type::urlencoded) {
      parser_.parse_query(body_);
    }
  }